

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  u8 uVar1;
  short sVar2;
  uint uVar3;
  MemPage *pMVar4;
  int iVar5;
  long lVar6;
  ushort uVar7;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  *pRes = 0;
  if (pCur->eState == '\x01') {
    sVar2 = pCur->iPage;
    pMVar4 = pCur->apPage[sVar2];
    uVar7 = pCur->aiIdx[sVar2] + 1;
    pCur->aiIdx[sVar2] = uVar7;
    if (pMVar4->nCell <= uVar7) {
      pCur->aiIdx[pCur->iPage] = pCur->aiIdx[pCur->iPage] - 1;
      iVar5 = btreeNext(pCur,pRes);
      return iVar5;
    }
    if (pMVar4->leaf != '\0') {
      return 0;
    }
    lVar6 = (long)pCur->iPage;
    pMVar4 = pCur->apPage[lVar6];
    uVar1 = pMVar4->leaf;
    while( true ) {
      if (uVar1 != '\0') {
        return 0;
      }
      uVar3 = *(uint *)(pMVar4->aData +
                       (CONCAT11(pMVar4->aCellIdx[(ulong)pCur->aiIdx[lVar6] * 2],
                                 pMVar4->aCellIdx[(ulong)pCur->aiIdx[lVar6] * 2 + 1]) &
                       pMVar4->maskPage));
      iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
      if (iVar5 != 0) break;
      lVar6 = (long)pCur->iPage;
      pMVar4 = pCur->apPage[lVar6];
      uVar1 = pMVar4->leaf;
    }
    return iVar5;
  }
  if (pCur->eState != 1) {
    iVar5 = 0;
    if (2 < pCur->eState) {
      iVar5 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar5 != 0) {
      return iVar5;
    }
    if (pCur->eState == '\0') {
      *pRes = 1;
      return 0;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar5) {
        return 0;
      }
    }
  }
  sVar2 = pCur->iPage;
  pMVar4 = pCur->apPage[sVar2];
  uVar7 = pCur->aiIdx[sVar2] + 1;
  pCur->aiIdx[sVar2] = uVar7;
  if (uVar7 < pMVar4->nCell) {
    if (pMVar4->leaf == '\0') {
LAB_001380a3:
      iVar5 = moveToLeftmost(pCur);
      return iVar5;
    }
  }
  else {
    if (pMVar4->leaf == '\0') {
      uVar3 = *(uint *)(pMVar4->aData + (ulong)pMVar4->hdrOffset + 8);
      iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
      if (iVar5 != 0) {
        return iVar5;
      }
      goto LAB_001380a3;
    }
    do {
      if (pCur->iPage == 0) {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      moveToParent(pCur);
    } while (pCur->apPage[pCur->iPage]->nCell <= pCur->aiIdx[pCur->iPage]);
    if (pCur->apPage[pCur->iPage]->intKey != '\0') {
      iVar5 = sqlite3BtreeNext(pCur,pRes);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorHoldsMutex(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}